

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scurve.c
# Opt level: O0

void SCurvePosCtrl_CycleLimited(SCurvePosCtrl_t *pSCurvePosCtrl)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  float coeff_c;
  float coeff_b;
  float coeff_a;
  SCurvePosCtrl_t *pSCurvePosCtrl_local;
  
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0 =
       (pSCurvePosCtrl->Spd +
       (pSCurvePosCtrl->Acc * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle + -pSCurvePosCtrl->Spd))
       / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec)) * 0.5 *
       ((pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle + pSCurvePosCtrl->Spd) /
       (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec)) +
       ((pSCurvePosCtrl->Spd + pSCurvePosCtrl->Spd +
        (pSCurvePosCtrl->Acc * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle + -pSCurvePosCtrl->Spd))
        / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec)) * 0.5 *
       (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle + -pSCurvePosCtrl->Spd)) /
       (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec);
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 =
       pSCurvePosCtrl->Spd * 0.5 *
       (pSCurvePosCtrl->Cycle * 2.0 - ABS(pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Acc);
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 =
       (pSCurvePosCtrl->Spd * 0.5 * ABS(pSCurvePosCtrl->Spd)) / pSCurvePosCtrl->Acc;
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 =
       (pSCurvePosCtrl->Spd -
       (pSCurvePosCtrl->Acc * (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle + -pSCurvePosCtrl->Spd))
       / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec)) * 0.5 *
       ((-pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle + pSCurvePosCtrl->Spd) /
       (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec)) +
       ((pSCurvePosCtrl->Spd + pSCurvePosCtrl->Spd +
        -((pSCurvePosCtrl->Acc *
          (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle + -pSCurvePosCtrl->Spd)) /
         (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec))) * 0.5 *
       (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle + -pSCurvePosCtrl->Spd)) /
       (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec);
  do {
    if (pSCurvePosCtrl->Spd <= 0.0) {
      if (pSCurvePosCtrl->DeltaPos < pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0 ||
          pSCurvePosCtrl->DeltaPos == pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0) {
        if ((pSCurvePosCtrl->DeltaPos < pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 ||
             pSCurvePosCtrl->DeltaPos == pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2) ||
           (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0 < pSCurvePosCtrl->DeltaPos)) {
          if ((pSCurvePosCtrl->DeltaPos < pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 ||
               pSCurvePosCtrl->DeltaPos == pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1) ||
             (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 < pSCurvePosCtrl->DeltaPos)) {
            if ((pSCurvePosCtrl->DeltaPos < pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 ||
                 pSCurvePosCtrl->DeltaPos == pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3) ||
               (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 < pSCurvePosCtrl->DeltaPos)) {
              if (pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3) {
                if (0.0 < pSCurvePosCtrl->Acc) {
                  pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
                  pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
                }
                pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccStep;
                pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
              }
            }
            else {
              pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
              pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
            }
          }
          else {
            pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
            pSCurvePosCtrl->Dec = -pSCurvePosCtrl->Acc;
          }
        }
        else {
          pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
          pSCurvePosCtrl->Dec = ABS(pSCurvePosCtrl->Acc);
        }
      }
      else {
        pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc + pSCurvePosCtrl->AccStep;
        pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
      }
    }
    else if (pSCurvePosCtrl->DeltaPos < pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0 ||
             pSCurvePosCtrl->DeltaPos == pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0) {
      if ((pSCurvePosCtrl->DeltaPos < pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 ||
           pSCurvePosCtrl->DeltaPos == pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1) ||
         (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0 < pSCurvePosCtrl->DeltaPos)) {
        if ((pSCurvePosCtrl->DeltaPos < pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 ||
             pSCurvePosCtrl->DeltaPos == pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2) ||
           (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 < pSCurvePosCtrl->DeltaPos)) {
          if ((pSCurvePosCtrl->DeltaPos < pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 ||
               pSCurvePosCtrl->DeltaPos == pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3) ||
             (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 < pSCurvePosCtrl->DeltaPos)) {
            if (pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3) {
              if (0.0 < pSCurvePosCtrl->Acc) {
                pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
                pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
              }
              pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccStep;
              pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
            }
          }
          else {
            pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
            pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
          }
        }
        else {
          pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
          pSCurvePosCtrl->Dec = ABS(pSCurvePosCtrl->Acc);
        }
      }
      else {
        pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
        pSCurvePosCtrl->Dec = ABS(pSCurvePosCtrl->Acc);
      }
    }
    else {
      pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc + pSCurvePosCtrl->AccStep;
      pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
    }
    fVar2 = pSCurvePosCtrl->Acc / pSCurvePosCtrl->Dec + 1.0;
    fVar1 = -(pSCurvePosCtrl->Cycle + pSCurvePosCtrl->Cycle +
             -((pSCurvePosCtrl->Spd * 2.0) / pSCurvePosCtrl->Dec));
    fVar3 = -(pSCurvePosCtrl->Cycle * 2.0 * pSCurvePosCtrl->Spd * pSCurvePosCtrl->Dec +
             -(pSCurvePosCtrl->Spd * pSCurvePosCtrl->Spd)) /
            (pSCurvePosCtrl->Acc * pSCurvePosCtrl->Dec) +
            (pSCurvePosCtrl->DeltaPos * 2.0) / pSCurvePosCtrl->Acc;
    if (0.0001 <= ABS(fVar2)) {
      dVar4 = sqrt((double)(fVar1 * fVar1 + -(fVar2 * 4.0 * fVar3)));
      pSCurvePosCtrl->AccTime = (float)(((double)-fVar1 - dVar4) / (double)(fVar2 * 2.0));
      pSCurvePosCtrl->DecTime =
           (pSCurvePosCtrl->Acc * pSCurvePosCtrl->AccTime + pSCurvePosCtrl->Spd) /
           pSCurvePosCtrl->Dec;
      pSCurvePosCtrl->MidTime =
           (pSCurvePosCtrl->Cycle - pSCurvePosCtrl->AccTime) - pSCurvePosCtrl->DecTime;
    }
    else {
      pSCurvePosCtrl->AccTime =
           (-(pSCurvePosCtrl->Cycle * 2.0) * pSCurvePosCtrl->Spd +
           pSCurvePosCtrl->DeltaPos + pSCurvePosCtrl->DeltaPos +
           -((pSCurvePosCtrl->Spd * pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Acc)) /
           (pSCurvePosCtrl->Spd + pSCurvePosCtrl->Spd +
           pSCurvePosCtrl->Acc * 2.0 * pSCurvePosCtrl->Cycle);
      pSCurvePosCtrl->DecTime = -pSCurvePosCtrl->Spd / pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccTime
      ;
      pSCurvePosCtrl->MidTime =
           (pSCurvePosCtrl->Cycle - pSCurvePosCtrl->AccTime) - pSCurvePosCtrl->DecTime;
    }
  } while ((((pSCurvePosCtrl->AccTime < 0.0) || (pSCurvePosCtrl->DecTime < 0.0)) ||
           (pSCurvePosCtrl->MidTime < 0.0)) || (fVar1 * fVar1 + -(fVar2 * 4.0 * fVar3) < 0.0));
  return;
}

Assistant:

static void SCurvePosCtrl_CycleLimited(SCurvePosCtrl_t *pSCurvePosCtrl)
{
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0 = 0.5f * (2.0f * pSCurvePosCtrl->Spd + pSCurvePosCtrl->Acc * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec)) * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec) + 0.5f * (pSCurvePosCtrl->Spd + pSCurvePosCtrl->Acc * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec)) * ((pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle + pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec));
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 = 0.5f * pSCurvePosCtrl->Spd * (2.0f * pSCurvePosCtrl->Cycle - fabs(pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Acc);
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 = 0.5f * pSCurvePosCtrl->Spd * fabs(pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Acc;
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 = 0.5f * (2.0f * pSCurvePosCtrl->Spd - pSCurvePosCtrl->Acc * (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec)) * (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec) + 0.5f * (pSCurvePosCtrl->Spd - pSCurvePosCtrl->Acc * (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec)) * ((-pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle + pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec));

	while (1)
	{
		if (pSCurvePosCtrl->Spd > 0)
		{
			if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc + pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = fabs(pSCurvePosCtrl->Acc);
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1)
			{
				pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = fabs(pSCurvePosCtrl->Acc);
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2)
			{
				pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3)
			{
				if (pSCurvePosCtrl->Acc > 0)
				{
					pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
					pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
				}
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
		}
		else
		{
			if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc + pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}

			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = fabs(pSCurvePosCtrl->Acc);
			}

			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = -pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1)
			{
				pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3)
			{
				if (pSCurvePosCtrl->Acc > 0)
				{
					pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
					pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
				}
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
		}

		float coeff_a = 1.0f + pSCurvePosCtrl->Acc / pSCurvePosCtrl->Dec;
		float coeff_b = -(2.0f * pSCurvePosCtrl->Cycle - 2.0f * pSCurvePosCtrl->Spd / pSCurvePosCtrl->Dec);
		float coeff_c = -(2.0f * pSCurvePosCtrl->Cycle * pSCurvePosCtrl->Spd * pSCurvePosCtrl->Dec - pSCurvePosCtrl->Spd * pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc * pSCurvePosCtrl->Dec) + 2.0f * pSCurvePosCtrl->DeltaPos / pSCurvePosCtrl->Acc;

		if (fabs(coeff_a) < SCURVE_EQUAL_ERROR)
		{
			pSCurvePosCtrl->AccTime = (2.0f * pSCurvePosCtrl->DeltaPos - pSCurvePosCtrl->Spd * pSCurvePosCtrl->Spd / pSCurvePosCtrl->Acc - 2.0f * pSCurvePosCtrl->Cycle * pSCurvePosCtrl->Spd) / (2.0f * pSCurvePosCtrl->Spd + 2.0f * pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle);
			pSCurvePosCtrl->DecTime = -pSCurvePosCtrl->Spd / pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccTime;
			pSCurvePosCtrl->MidTime = pSCurvePosCtrl->Cycle - pSCurvePosCtrl->AccTime - pSCurvePosCtrl->DecTime;
		}
		else
		{
			pSCurvePosCtrl->AccTime = (-coeff_b - sqrt(coeff_b * coeff_b - 4.0f * coeff_a * coeff_c)) / (2.0f * coeff_a);
			pSCurvePosCtrl->DecTime = (pSCurvePosCtrl->Spd + pSCurvePosCtrl->Acc * pSCurvePosCtrl->AccTime) / pSCurvePosCtrl->Dec;
			pSCurvePosCtrl->MidTime = pSCurvePosCtrl->Cycle - pSCurvePosCtrl->AccTime - pSCurvePosCtrl->DecTime;
		}

		if (pSCurvePosCtrl->AccTime >= 0 && pSCurvePosCtrl->DecTime >= 0 && pSCurvePosCtrl->MidTime >= 0 && coeff_b * coeff_b - 4.0f * coeff_a * coeff_c >= 0.0f)
		{
			//printf("acc:%f dec:%f", pSCurvePosCtrl->Acc, pSCurvePosCtrl->Dec);
			break;
		}
		//printf("AccTime:%f DecTime:%f MidTime:%f det:%f acc:%f dec:%f\n", pSCurvePosCtrl->AccTime, pSCurvePosCtrl->DecTime, pSCurvePosCtrl->MidTime, coeff_b * coeff_b - 4.0f * coeff_a * coeff_c, pSCurvePosCtrl->Acc, pSCurvePosCtrl->Dec);
	}
}